

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

bool __thiscall CFG::containsNode(CFG *this,CfgNode *node)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  if (node != (CfgNode *)0x0) {
    p_Var3 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &p_Var3->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(CfgNode **)(p_Var2 + 1) < node])
    {
      if (*(CfgNode **)(p_Var2 + 1) >= node) {
        p_Var1 = p_Var2;
      }
    }
    p_Var2 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, node < *(CfgNode **)(p_Var1 + 1))
       ) {
      p_Var2 = &p_Var3->_M_header;
    }
    return (_Rb_tree_header *)p_Var2 != p_Var3;
  }
  return false;
}

Assistant:

bool CFG::containsNode(CfgNode* node) const {
	return node ? (m_nodes.count(node) == 1) : false;
}